

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

size_t __thiscall PPrototype::PropagateMark(PPrototype *this)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  
  GC::MarkArray<PType*>(&this->ArgumentTypes);
  GC::MarkArray<PType*>(&this->ReturnTypes);
  uVar1 = (this->ReturnTypes).Count;
  uVar2 = (this->ArgumentTypes).Count;
  sVar3 = PType::PropagateMark((PType *)this);
  return sVar3 + (ulong)(uVar1 + uVar2) * 8;
}

Assistant:

size_t PPrototype::PropagateMark()
{
	GC::MarkArray(ArgumentTypes);
	GC::MarkArray(ReturnTypes);
	return (ArgumentTypes.Size() + ReturnTypes.Size()) * sizeof(void*) +
		Super::PropagateMark();
}